

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::operator+=(path *this,value_type x)

{
  ulong uVar1;
  char *pcVar2;
  value_type x_local;
  path *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 == '/') goto LAB_002a8723;
  }
  std::__cxx11::string::operator+=((string *)this,x);
LAB_002a8723:
  check_long_path(this);
  return this;
}

Assistant:

GHC_INLINE path& path::operator+=(value_type x)
{
#ifdef GHC_OS_WINDOWS
    if (x == generic_separator) {
        x = preferred_separator;
    }
#endif
    if (_path.empty() || _path.back() != preferred_separator) {
        _path += x;
    }
    check_long_path();
    return *this;
}